

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

void __thiscall CVmHandleManager::delete_obj(CVmHandleManager *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = this->handles_max_;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (this->handles_[uVar2] != (void *)0x0) {
        (*this->_vptr_CVmHandleManager[2])(this,(ulong)((int)uVar2 + 1));
        uVar1 = this->handles_max_;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  (*this->_vptr_CVmHandleManager[1])(this);
  return;
}

Assistant:

void CVmHandleManager::delete_obj(VMG0_)
{
    size_t i;

    /* 
     *   Delete each remaining object.  Note that we need to call the virtual
     *   delete_handle_object routine, so we must do this before reaching the
     *   destructor (once in the base class destructor, we no longer have
     *   access to the subclass virtuals).  
     */
    for (i = 0 ; i < handles_max_ ; ++i)
    {
        /* if this banner is still valid, delete it */
        if (handles_[i] != 0)
            delete_handle_object(vmg_ i + 1, handles_[i]);
    }

    /* delete the object */
    delete this;
}